

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ossl_bio_cf_in_read(BIO *bio,char *buf,int blen)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  undefined8 *puVar3;
  CURLcode CVar4;
  Curl_cfilter *cf;
  ulong uVar5;
  CURLcode local_44;
  Curl_easy *local_40;
  undefined8 *local_38;
  
  cf = (Curl_cfilter *)BIO_get_data();
  pvVar1 = cf->ctx;
  local_38 = *(undefined8 **)((long)pvVar1 + 0x30);
  local_40 = *(Curl_easy **)((long)pvVar1 + 0x38);
  local_44 = CURLE_RECV_ERROR;
  uVar5 = 0;
  if (-1 < blen && buf != (char *)0x0) {
    uVar5 = Curl_conn_cf_recv(cf->next,local_40,buf,(ulong)(uint)blen,&local_44);
    if ((((local_40 != (Curl_easy *)0x0) && (((local_40->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar2 = (local_40->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
         ))) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(local_40,cf,"ossl_bio_cf_in_read(len=%d) -> %d, err=%d",(ulong)(uint)blen,
                        uVar5 & 0xffffffff,(ulong)local_44);
    }
    BIO_clear_flags((BIO *)bio,0xf);
    puVar3 = local_38;
    *(CURLcode *)(local_38 + 4) = local_44;
    if ((long)uVar5 < 0) {
      if (local_44 == CURLE_AGAIN) {
        BIO_set_flags((BIO *)bio,9);
      }
    }
    else if (uVar5 == 0) {
      *(byte *)((long)pvVar1 + 0xb8) = *(byte *)((long)pvVar1 + 0xb8) | 2;
    }
    if ((*(byte *)((long)puVar3 + 0x25) & 1) == 0) {
      CVar4 = Curl_ssl_setup_x509_store(cf,local_40,(SSL_CTX *)*puVar3);
      if (CVar4 == CURLE_OK) {
        *(byte *)((long)puVar3 + 0x25) = *(byte *)((long)puVar3 + 0x25) | 1;
      }
      else {
        *(CURLcode *)(puVar3 + 4) = CVar4;
        uVar5 = 0xffffffffffffffff;
      }
    }
  }
  return (int)uVar5;
}

Assistant:

static int ossl_bio_cf_in_read(BIO *bio, char *buf, int blen)
{
  struct Curl_cfilter *cf = BIO_get_data(bio);
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  ssize_t nread;
  CURLcode result = CURLE_RECV_ERROR;

  DEBUGASSERT(data);
  /* OpenSSL catches this case, so should we. */
  if(!buf)
    return 0;
  if(blen < 0)
    return 0;

  nread = Curl_conn_cf_recv(cf->next, data, buf, (size_t)blen, &result);
  CURL_TRC_CF(data, cf, "ossl_bio_cf_in_read(len=%d) -> %d, err=%d",
              blen, (int)nread, result);
  BIO_clear_retry_flags(bio);
  octx->io_result = result;
  if(nread < 0) {
    if(CURLE_AGAIN == result)
      BIO_set_retry_read(bio);
  }
  else if(nread == 0) {
    connssl->peer_closed = TRUE;
  }

  /* Before returning server replies to the SSL instance, we need
   * to have setup the x509 store or verification will fail. */
  if(!octx->x509_store_setup) {
    result = Curl_ssl_setup_x509_store(cf, data, octx->ssl_ctx);
    if(result) {
      octx->io_result = result;
      return -1;
    }
    octx->x509_store_setup = TRUE;
  }

  return (int)nread;
}